

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int Strsafe_insert(char *data)

{
  s_x1node *__s;
  s_x1node *psVar1;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  s_x1node **ppsVar5;
  s_x1 *psVar6;
  int iVar7;
  int iVar8;
  s_x1node *psVar9;
  char cVar10;
  char *pcVar11;
  ulong uVar12;
  uint uVar13;
  char *pcVar14;
  long lVar15;
  
  psVar6 = x1a;
  if (x1a == (s_x1 *)0x0) {
LAB_0010b315:
    iVar7 = 0;
  }
  else {
    cVar10 = *data;
    if (cVar10 == '\0') {
      iVar7 = 0;
    }
    else {
      pcVar11 = data + 1;
      iVar7 = 0;
      do {
        iVar7 = (int)cVar10 + iVar7 * 0xd;
        cVar10 = *pcVar11;
        pcVar11 = pcVar11 + 1;
      } while (cVar10 != '\0');
    }
    iVar3 = x1a->size;
    lVar15 = (long)iVar3;
    for (psVar9 = x1a->ht[lVar15 - 1U & (long)iVar7]; psVar9 != (s_x1node *)0x0;
        psVar9 = psVar9->next) {
      iVar8 = strcmp(psVar9->data,data);
      if (iVar8 == 0) goto LAB_0010b315;
    }
    uVar4 = psVar6->count;
    if (iVar3 <= (int)uVar4) {
      psVar9 = (s_x1node *)malloc(lVar15 << 6);
      if (psVar9 == (s_x1node *)0x0) goto LAB_0010b315;
      __s = psVar9 + lVar15 * 2;
      iVar8 = (int)(lVar15 * 2);
      if (0 < iVar3) {
        uVar12 = 1;
        if (1 < iVar8) {
          uVar12 = lVar15 * 2 & 0xffffffff;
        }
        memset(__s,0,uVar12 << 3);
      }
      if (0 < (int)uVar4) {
        uVar12 = 0;
        do {
          pcVar11 = psVar6->tbl[uVar12].data;
          cVar10 = *pcVar11;
          uVar13 = 0;
          if (cVar10 != '\0') {
            uVar13 = 0;
            pcVar14 = pcVar11;
            do {
              pcVar14 = pcVar14 + 1;
              uVar13 = (int)cVar10 + uVar13 * 0xd;
              cVar10 = *pcVar14;
            } while (cVar10 != '\0');
          }
          uVar13 = uVar13 & iVar8 - 1U;
          psVar1 = psVar9 + uVar12;
          if ((&__s->data)[(int)uVar13] != (char *)0x0) {
            *(s_x1node ***)((&__s->data)[(int)uVar13] + 0x10) = &psVar1->next;
          }
          ppcVar2 = &__s->data + (int)uVar13;
          psVar1->next = (s_x1node *)*ppcVar2;
          psVar1->data = pcVar11;
          psVar1->from = (s_x1node **)ppcVar2;
          *ppcVar2 = (char *)psVar1;
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar4);
      }
      free(psVar6->tbl);
      psVar6->size = iVar8;
      psVar6->count = uVar4;
      psVar6->tbl = psVar9;
      psVar6->ht = (s_x1node **)__s;
    }
    uVar12 = (long)psVar6->size - 1U & (long)iVar7;
    iVar7 = psVar6->count;
    psVar6->count = iVar7 + 1;
    psVar9 = psVar6->tbl + iVar7;
    psVar9->data = data;
    ppsVar5 = psVar6->ht;
    if (ppsVar5[uVar12] != (s_x1node *)0x0) {
      ppsVar5[uVar12]->from = &psVar9->next;
    }
    psVar9->next = ppsVar5[uVar12];
    ppsVar5[uVar12] = psVar9;
    psVar9->from = psVar6->ht + uVar12;
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int Strsafe_insert(const char *data)
{
  x1node *np;
  int h;
  int ph;

  if( x1a==0 ) return 0;
  ph = strhash(data);
  h = ph & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,data)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x1a->count>=x1a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x1 array;
    array.size = size = x1a->size*2;
    array.count = x1a->count;
    array.tbl = (x1node*)malloc(
      (sizeof(x1node) + sizeof(x1node*))*size );
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x1node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x1a->count; i++){
      x1node *oldnp, *newnp;
      oldnp = &(x1a->tbl[i]);
      h = strhash(oldnp->data) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x1a->tbl);
    *x1a = array;
  }
  /* Insert the new data */
  h = ph & (x1a->size-1);
  np = &(x1a->tbl[x1a->count++]);
  np->data = data;
  if( x1a->ht[h] ) x1a->ht[h]->from = &(np->next);
  np->next = x1a->ht[h];
  x1a->ht[h] = np;
  np->from = &(x1a->ht[h]);
  return 1;
}